

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O0

void __thiscall
ASN1Test_NegativeZero_Test::~ASN1Test_NegativeZero_Test(ASN1Test_NegativeZero_Test *this)

{
  ASN1Test_NegativeZero_Test *this_local;
  
  ~ASN1Test_NegativeZero_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ASN1Test, NegativeZero) {
  bssl::UniquePtr<ASN1_INTEGER> neg_zero(
      ASN1_STRING_type_new(V_ASN1_NEG_INTEGER));
  ASSERT_TRUE(neg_zero);
  EXPECT_EQ(0, ASN1_INTEGER_get(neg_zero.get()));

  static const uint8_t kDER[] = {0x02, 0x01, 0x00};
  TestSerialize(neg_zero.get(), i2d_ASN1_INTEGER, kDER);
}